

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

AssignmentPatternItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::AssignmentPatternItemSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,ExpressionSyntax *args,Token *args_1,ExpressionSyntax *args_2)

{
  Token colon;
  AssignmentPatternItemSyntax *pAVar1;
  ExpressionSyntax *in_RCX;
  BumpAllocator *in_RDX;
  AssignmentPatternItemSyntax *in_RSI;
  undefined8 in_RDI;
  Info *unaff_retaddr;
  size_t in_stack_ffffffffffffffd8;
  
  pAVar1 = (AssignmentPatternItemSyntax *)allocate(in_RDX,(size_t)in_RCX,in_stack_ffffffffffffffd8);
  colon.info = unaff_retaddr;
  colon.kind = (short)in_RDI;
  colon._2_1_ = (char)((ulong)in_RDI >> 0x10);
  colon.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  colon.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::AssignmentPatternItemSyntax::AssignmentPatternItemSyntax
            (in_RSI,(ExpressionSyntax *)in_RDX,colon,in_RCX);
  return pAVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }